

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O1

void __thiscall cs::statement_for::run_impl(statement_for *this)

{
  bool bVar1;
  element_type *peVar2;
  _Elt_pointer ppsVar3;
  statement_base *psVar4;
  undefined *puVar5;
  int iVar6;
  ulong uVar7;
  bool *pbVar8;
  _Elt_pointer ptVar9;
  ulong uVar10;
  long lVar11;
  _Elt_pointer ppsVar12;
  _Elt_pointer ppsVar13;
  _Map_pointer pppsVar14;
  scope_guard scope;
  scope_guard top_scope;
  tree_node *local_c0;
  slot_type *local_b8;
  scope_guard local_b0;
  scope_guard local_a8;
  CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
  local_98;
  
  peVar2 = (((this->super_statement_base).context.
             super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance).
           super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2->break_block == true) {
    peVar2->break_block = false;
  }
  local_b8 = (slot_type *)&(this->super_statement_base).context;
  if (peVar2->continue_block == true) {
    peVar2->continue_block = false;
  }
  local_a8.context = (context_t *)local_b8;
  domain_manager::add_domain(&(peVar2->super_runtime_type).storage);
  ptVar9 = (this->mParallel).
           super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  uVar7 = (long)ptVar9 -
          (long)(this->mParallel).
                super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_first >> 3;
  if (0x3f < uVar7) {
    uVar10 = uVar7 >> 6 | 0xfc00000000000000;
    if (0 < (long)uVar7) {
      uVar10 = uVar7 >> 6;
    }
    ptVar9 = (this->mParallel).
             super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node[uVar10] + uVar7 + uVar10 * -0x40;
  }
  instance_type::parse_define_var
            ((((this->super_statement_base).context.
               super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance).
             super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,ptVar9->mRoot,
             false,false);
  local_b0.context = (context_t *)local_b8;
  domain_manager::add_domain
            (&(((((element_type *)(local_b8->value).first._M_dataplus._M_p)->instance).
                super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_runtime_type).storage);
  while( true ) {
    puVar5 = current_process;
    if ((*current_process & 1) != 0) {
      LOCK();
      *current_process = 0;
      UNLOCK();
      event_type::touch((event_type *)(puVar5 + 0xd0),(void *)0x0);
    }
    ptVar9 = (this->mParallel).
             super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    lVar11 = (long)ptVar9 -
             (long)(this->mParallel).
                   super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_first >> 3;
    uVar7 = lVar11 + 1;
    if (uVar7 < 0x40) {
      ptVar9 = ptVar9 + 1;
    }
    else {
      uVar10 = uVar7 >> 6 | 0xfc00000000000000;
      if (-1 < lVar11) {
        uVar10 = uVar7 >> 6;
      }
      ptVar9 = (this->mParallel).
               super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node[uVar10] + uVar7 + uVar10 * -0x40;
    }
    local_98.
    super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
    .
    super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
    .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
              )ptVar9->mRoot;
    runtime_type::parse_expr
              ((runtime_type *)&local_c0,
               (iterator *)
               (((this->super_statement_base).context.
                 super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance)
               .super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               SUB81(&stack0xffffffffffffff68,0));
    pbVar8 = cs_impl::any::const_val<bool>((any *)&local_c0);
    bVar1 = *pbVar8;
    cs_impl::any::recycle((any *)&local_c0);
    if (bVar1 == false) break;
    ppsVar13 = (this->mBlock).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur;
    ppsVar3 = (this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_cur;
    if (ppsVar13 != ppsVar3) {
      ppsVar12 = (this->mBlock).
                 super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_last;
      pppsVar14 = (this->mBlock).
                  super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        puVar5 = current_process;
        psVar4 = *ppsVar13;
        if ((*current_process & 1) != 0) {
          LOCK();
          *current_process = 0;
          UNLOCK();
          event_type::touch((event_type *)(puVar5 + 0xd0),(void *)0x0);
        }
        (*psVar4->_vptr_statement_base[3])(psVar4);
        peVar2 = (((element_type *)(local_b8->value).first._M_dataplus._M_p)->instance).
                 super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        iVar6 = 1;
        if (peVar2->return_fcall == false) {
          if (peVar2->break_block == true) {
            peVar2->break_block = false;
            goto LAB_0016b2bc;
          }
          if (peVar2->continue_block == true) {
            peVar2->continue_block = false;
            iVar6 = 4;
            goto LAB_0016b2bc;
          }
          iVar6 = 0;
          bVar1 = true;
        }
        else {
LAB_0016b2bc:
          bVar1 = false;
        }
        if (!bVar1) goto LAB_0016b2f1;
        ppsVar13 = ppsVar13 + 1;
        if (ppsVar13 == ppsVar12) {
          ppsVar13 = pppsVar14[1];
          pppsVar14 = pppsVar14 + 1;
          ppsVar12 = ppsVar13 + 0x40;
        }
      } while (ppsVar13 != ppsVar3);
      iVar6 = 4;
LAB_0016b2f1:
      if (iVar6 != 4) break;
    }
    ptVar9 = (this->mParallel).
             super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    lVar11 = (long)ptVar9 -
             (long)(this->mParallel).
                   super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_first >> 3;
    uVar7 = lVar11 + 2;
    if (uVar7 < 0x40) {
      ptVar9 = ptVar9 + 2;
    }
    else {
      uVar10 = uVar7 >> 6 | 0xfc00000000000000;
      if (-2 < lVar11) {
        uVar10 = uVar7 >> 6;
      }
      ptVar9 = (this->mParallel).
               super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node[uVar10] + uVar7 + uVar10 * -0x40;
    }
    local_c0 = ptVar9->mRoot;
    runtime_type::parse_expr
              ((runtime_type *)&stack0xffffffffffffff60,
               (iterator *)
               (((this->super_statement_base).context.
                 super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance)
               .super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               SUB81(&local_c0,0));
    cs_impl::any::recycle((any *)&stack0xffffffffffffff60);
    domain_manager::next_domain
              (&(((((element_type *)
                   (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &(local_b0.context)->
                     super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)->_M_dataplus)
                   ._M_p)->instance).
                  super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_runtime_type).storage);
  }
  scope_guard::~scope_guard(&local_b0);
  scope_guard::~scope_guard(&local_a8);
  return;
}

Assistant:

void statement_for::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		if (context->instance->break_block)
			context->instance->break_block = false;
		if (context->instance->continue_block)
			context->instance->continue_block = false;
		scope_guard top_scope(context);
		context->instance->parse_define_var(mParallel[0].root());
		scope_guard scope(context);
		while (true) {
			current_process->poll_event();
			if (!context->instance->parse_expr(mParallel[1].root()).const_val<boolean>())
				break;
			for (auto &ptr: mBlock) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall) {
					return;
				}
				if (context->instance->break_block) {
					context->instance->break_block = false;
					return;
				}
				if (context->instance->continue_block) {
					context->instance->continue_block = false;
					break;
				}
			}
			context->instance->parse_expr(mParallel[2].root());
			scope.clear();
		}
	}